

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

MessageType __thiscall
cmMakefile::ExpandVariablesInStringNew
          (cmMakefile *this,string *errorstr,string *source,bool escapeQuotes,bool noEscapes,
          bool atOnly,char *filename,long line,bool replaceAt)

{
  t_domain tVar1;
  long lVar2;
  size_type sVar3;
  uint uVar4;
  bool bVar5;
  int iVar6;
  _Alloc_hider __s;
  byte *pbVar7;
  string *psVar8;
  size_t sVar9;
  undefined8 uVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  ostream *poVar12;
  long *plVar13;
  undefined7 in_register_00000009;
  ulong *puVar14;
  ulong uVar15;
  size_type *psVar16;
  byte *pbVar17;
  undefined7 in_register_00000081;
  undefined3 in_register_00000089;
  uint uVar18;
  byte *pbVar19;
  byte *pbVar20;
  byte bVar21;
  string varresult;
  vector<t_lookup,_std::allocator<t_lookup>_> openstack;
  string result;
  string svalue;
  ostringstream ostr;
  string local_2c0;
  string *local_2a0;
  string local_298;
  cmMakefile *local_278;
  MessageType local_26c;
  t_lookup *local_268;
  iterator iStack_260;
  t_lookup *local_258;
  undefined1 *local_248;
  size_t local_240;
  undefined1 local_238;
  undefined7 uStack_237;
  ulong local_228;
  undefined4 local_21c;
  ulong local_218;
  string local_210;
  undefined4 local_1f0;
  undefined4 local_1ec;
  string local_1e8;
  string *local_1c8;
  unsigned_long local_1c0;
  RegularExpression *local_1b8;
  cmState *local_1b0;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_1f0 = CONCAT31(in_register_00000089,atOnly);
  local_1ec = (undefined4)CONCAT71(in_register_00000081,noEscapes);
  local_21c = (undefined4)CONCAT71(in_register_00000009,escapeQuotes);
  pbVar17 = (byte *)(source->_M_dataplus)._M_p;
  local_248 = &local_238;
  local_240 = 0;
  local_238 = 0;
  local_2a0 = errorstr;
  local_1c8 = source;
  std::__cxx11::string::reserve((ulong)&local_248);
  local_268 = (t_lookup *)0x0;
  iStack_260._M_current = (t_lookup *)0x0;
  local_258 = (t_lookup *)0x0;
  local_1b0 = this->GlobalGenerator->CMakeInstance->State;
  if ((ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool)
       ::lineVar_abi_cxx11_ == '\0') &&
     (iVar6 = __cxa_guard_acquire(&ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool)
                                   ::lineVar_abi_cxx11_), iVar6 != 0)) {
    ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool)
    ::lineVar_abi_cxx11_._M_dataplus._M_p =
         (pointer)&ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool)
                   ::lineVar_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool)
                ::lineVar_abi_cxx11_,"CMAKE_CURRENT_LIST_LINE","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool)
                  ::lineVar_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool)
                         ::lineVar_abi_cxx11_);
  }
  local_228 = line;
  bVar21 = *pbVar17;
  local_1b8 = &this->cmNamedCurly;
  local_26c = LOG;
  local_218 = 0;
  pbVar20 = pbVar17;
  local_278 = this;
  do {
    if (bVar21 < 0x40) {
      if (bVar21 == 10) {
        local_228 = local_228 + 1;
      }
      else {
        if (bVar21 != 0x24) {
          if (bVar21 != 0) goto LAB_001cb871;
          if ((local_218 & 1) != 0) goto LAB_001cc13e;
          break;
        }
        if ((char)local_1f0 != '\0') goto LAB_001cb6f4;
        local_210._M_dataplus._M_p = local_210._M_dataplus._M_p & 0xffffffff00000000;
        local_210._M_string_length = 0;
        pbVar19 = pbVar17 + 1;
        bVar21 = pbVar17[1];
        if (bVar21 == 0) {
          std::__cxx11::string::append((char *)&local_248,(ulong)pbVar20);
          pbVar20 = pbVar19;
        }
        else if (bVar21 != 0x3c) {
          if (bVar21 == 0x7b) {
            pbVar19 = pbVar17 + 2;
          }
          else {
            iVar6 = strncmp((char *)pbVar19,"ENV{",4);
            if (iVar6 == 0) {
              pbVar19 = pbVar17 + 5;
              local_210._M_dataplus._M_p._0_4_ = 1;
            }
            else {
              iVar6 = strncmp((char *)pbVar19,"CACHE{",6);
              if (iVar6 != 0) {
                bVar5 = cmsys::RegularExpression::find
                                  (local_1b8,(char *)pbVar19,&local_1b8->regmatch);
                if (bVar5) {
                  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_298,pbVar19,
                             pbVar19 + ((long)(local_278->cmNamedCurly).regmatch.endp[0] -
                                       (long)(local_278->cmNamedCurly).regmatch.searchstring));
                  plVar13 = (long *)std::__cxx11::string::replace
                                              ((ulong)&local_298,0,(char *)0x0,0x4d8db6);
                  puVar14 = (ulong *)(plVar13 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar13 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)puVar14) {
                    local_2c0.field_2._M_allocated_capacity = *puVar14;
                    local_2c0.field_2._8_8_ = plVar13[3];
                    local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
                  }
                  else {
                    local_2c0.field_2._M_allocated_capacity = *puVar14;
                    local_2c0._M_dataplus._M_p = (pointer)*plVar13;
                  }
                  local_2c0._M_string_length = plVar13[1];
                  *plVar13 = (long)puVar14;
                  plVar13[1] = 0;
                  *(undefined1 *)(plVar13 + 2) = 0;
                  plVar13 = (long *)std::__cxx11::string::append((char *)&local_2c0);
                  psVar16 = (size_type *)(plVar13 + 2);
                  if ((size_type *)*plVar13 == psVar16) {
                    local_1a8._16_8_ = *psVar16;
                    local_1a8._24_8_ = plVar13[3];
                    local_1a8._0_8_ = local_1a8 + 0x10;
                  }
                  else {
                    local_1a8._16_8_ = *psVar16;
                    local_1a8._0_8_ = (size_type *)*plVar13;
                  }
                  local_1a8._8_8_ = plVar13[1];
                  *plVar13 = (long)psVar16;
                  plVar13[1] = 0;
                  *(undefined1 *)(plVar13 + 2) = 0;
                  std::__cxx11::string::operator=((string *)local_2a0,(string *)local_1a8);
                  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
                    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
                    operator_delete(local_2c0._M_dataplus._M_p,
                                    local_2c0.field_2._M_allocated_capacity + 1);
                  }
                  paVar11 = &local_298.field_2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_298._M_dataplus._M_p != paVar11) {
                    operator_delete(local_298._M_dataplus._M_p,
                                    CONCAT71(local_298.field_2._M_allocated_capacity._1_7_,
                                             local_298.field_2._M_local_buf[0]) + 1);
                    paVar11 = extraout_RAX;
                  }
                  local_26c = FATAL_ERROR;
                  local_218 = CONCAT71((int7)((ulong)paVar11 >> 8),1);
                }
                goto LAB_001cbfb5;
              }
              pbVar19 = pbVar17 + 7;
              local_210._M_dataplus._M_p._0_4_ = 2;
            }
          }
          std::__cxx11::string::append((char *)&local_248,(ulong)pbVar20);
          local_210._M_string_length = local_240;
          pbVar17 = pbVar19 + -1;
          pbVar20 = pbVar19;
          if (iStack_260._M_current == local_258) {
            std::vector<t_lookup,std::allocator<t_lookup>>::_M_realloc_insert<t_lookup_const&>
                      ((vector<t_lookup,std::allocator<t_lookup>> *)&local_268,iStack_260,
                       (t_lookup *)&local_210);
          }
          else {
            *(pointer *)iStack_260._M_current = local_210._M_dataplus._M_p;
            (iStack_260._M_current)->loc = local_240;
            iStack_260._M_current = iStack_260._M_current + 1;
          }
        }
      }
    }
    else if (bVar21 == 0x40) {
      if (replaceAt) {
        pbVar19 = pbVar17 + 1;
        pbVar7 = (byte *)strchr((char *)pbVar19,0x40);
        if ((pbVar7 != pbVar19 && pbVar7 != (byte *)0x0) &&
           (sVar9 = strspn((char *)pbVar19,
                           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789/_.+-"),
           pbVar7 == pbVar19 + sVar9)) {
          local_1a8._0_8_ = local_1a8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1a8,pbVar19,pbVar19 + ~(ulong)pbVar17 + (long)pbVar7);
          local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
          local_2c0._M_string_length = 0;
          local_2c0.field_2._M_allocated_capacity =
               local_2c0.field_2._M_allocated_capacity & 0xffffffffffffff00;
          if (((filename == (char *)0x0) ||
              (local_1a8._8_8_ !=
               ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool)
               ::lineVar_abi_cxx11_._M_string_length)) ||
             ((local_1a8._8_8_ != 0 &&
              (iVar6 = bcmp((void *)local_1a8._0_8_,
                            ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool)
                            ::lineVar_abi_cxx11_._M_dataplus._M_p,local_1a8._8_8_), iVar6 != 0)))) {
            psVar8 = GetDef(local_278,(string *)local_1a8);
            if (psVar8 == (string *)0x0) {
              if (local_278->SuppressSideEffects == false) {
                MaybeWarnUninitialized(local_278,(string *)local_1a8,filename);
              }
            }
            else {
              std::__cxx11::string::_M_assign((string *)&local_2c0);
            }
          }
          else {
            local_1c0 = -local_228;
            if (0 < (long)local_228) {
              local_1c0 = local_228;
            }
            uVar18 = 1;
            if (9 < local_1c0) {
              uVar15 = local_1c0;
              uVar4 = 4;
              do {
                uVar18 = uVar4;
                if (uVar15 < 100) {
                  uVar18 = uVar18 - 2;
                  goto LAB_001cbfdf;
                }
                if (uVar15 < 1000) {
                  uVar18 = uVar18 - 1;
                  goto LAB_001cbfdf;
                }
                if (uVar15 < 10000) goto LAB_001cbfdf;
                bVar5 = 99999 < uVar15;
                uVar15 = uVar15 / 10000;
                uVar4 = uVar18 + 4;
              } while (bVar5);
              uVar18 = uVar18 + 1;
            }
LAB_001cbfdf:
            lVar2 = (long)local_228 >> 0x3f;
            local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
            std::__cxx11::string::_M_construct
                      ((ulong)&local_298,(char)uVar18 - (char)((long)local_228 >> 0x3f));
            std::__detail::__to_chars_10_impl<unsigned_long>
                      (local_298._M_dataplus._M_p + -lVar2,uVar18,local_1c0);
            std::__cxx11::string::operator=((string *)&local_2c0,(string *)&local_298);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_298._M_dataplus._M_p != &local_298.field_2) {
              operator_delete(local_298._M_dataplus._M_p,
                              CONCAT71(local_298.field_2._M_allocated_capacity._1_7_,
                                       local_298.field_2._M_local_buf[0]) + 1);
            }
          }
          if ((char)local_21c != '\0') {
            cmSystemTools::EscapeQuotes(&local_298,&local_2c0);
            std::__cxx11::string::operator=((string *)&local_2c0,(string *)&local_298);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_298._M_dataplus._M_p != &local_298.field_2) {
              operator_delete(local_298._M_dataplus._M_p,
                              CONCAT71(local_298.field_2._M_allocated_capacity._1_7_,
                                       local_298.field_2._M_local_buf[0]) + 1);
            }
          }
          std::__cxx11::string::append((char *)&local_248,(ulong)pbVar20);
          std::__cxx11::string::_M_append((char *)&local_248,(ulong)local_2c0._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
            operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
          }
          if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
            operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
          }
          pbVar17 = pbVar7;
          pbVar20 = pbVar7 + 1;
          goto LAB_001cbfb5;
        }
      }
LAB_001cb871:
      if (((local_268 != iStack_260._M_current) && (iVar6 = isalnum((int)(char)bVar21), iVar6 == 0))
         && ((uVar18 = bVar21 - 0x2b, 0x34 < uVar18 ||
             ((0x1000000000001dU >> ((ulong)uVar18 & 0x3f) & 1) == 0)))) {
        std::__cxx11::string::append((char *)local_2a0);
        std::__cxx11::string::push_back((char)local_2a0);
        std::__cxx11::string::append((char *)&local_248,(ulong)pbVar20);
        std::__cxx11::string::substr((ulong)&local_298,(ulong)&local_248);
        plVar13 = (long *)std::__cxx11::string::replace((ulong)&local_298,0,(char *)0x0,0x4d8e8b);
        puVar14 = (ulong *)(plVar13 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar13 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar14) {
          local_2c0.field_2._M_allocated_capacity = *puVar14;
          local_2c0.field_2._8_8_ = plVar13[3];
          local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
        }
        else {
          local_2c0.field_2._M_allocated_capacity = *puVar14;
          local_2c0._M_dataplus._M_p = (pointer)*plVar13;
        }
        local_2c0._M_string_length = plVar13[1];
        *plVar13 = (long)puVar14;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        plVar13 = (long *)std::__cxx11::string::append((char *)&local_2c0);
        local_1a8._0_8_ = local_1a8 + 0x10;
        psVar16 = (size_type *)(plVar13 + 2);
        if ((size_type *)*plVar13 == psVar16) {
          local_1a8._16_8_ = *psVar16;
          local_1a8._24_8_ = plVar13[3];
        }
        else {
          local_1a8._16_8_ = *psVar16;
          local_1a8._0_8_ = (size_type *)*plVar13;
        }
        local_1a8._8_8_ = plVar13[1];
        *plVar13 = (long)psVar16;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_2a0,local_1a8._0_8_);
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
          operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          operator_delete(local_298._M_dataplus._M_p,
                          CONCAT71(local_298.field_2._M_allocated_capacity._1_7_,
                                   local_298.field_2._M_local_buf[0]) + 1);
        }
        goto LAB_001cc13e;
      }
    }
    else if (bVar21 == 0x5c) {
LAB_001cb6f4:
      if ((char)local_1ec != '\0') goto LAB_001cbfb5;
      bVar21 = pbVar17[1];
      if (bVar21 < 0x72) {
        if (bVar21 == 0x3b) {
          if (local_268 == iStack_260._M_current) goto LAB_001cbc16;
        }
        else if (bVar21 == 0x6e) {
          std::__cxx11::string::append((char *)&local_248,(ulong)pbVar20);
          std::__cxx11::string::append((char *)&local_248);
          goto LAB_001cbae8;
        }
LAB_001cba84:
        iVar6 = isalnum((int)(char)bVar21);
        if ((bVar21 == 0) || (iVar6 != 0)) {
          uVar10 = std::__cxx11::string::append((char *)local_2a0);
          if (bVar21 != 0) {
            uVar10 = std::__cxx11::string::push_back((char)local_2a0);
          }
          local_218 = CONCAT71((int7)((ulong)uVar10 >> 8),1);
          std::__cxx11::string::append((char *)local_2a0);
        }
        else {
          std::__cxx11::string::append((char *)&local_248,(ulong)pbVar20);
          pbVar20 = pbVar17 + 1;
        }
      }
      else {
        if (bVar21 == 0x72) {
          std::__cxx11::string::append((char *)&local_248,(ulong)pbVar20);
          std::__cxx11::string::append((char *)&local_248);
        }
        else {
          if (bVar21 != 0x74) goto LAB_001cba84;
          std::__cxx11::string::append((char *)&local_248,(ulong)pbVar20);
          std::__cxx11::string::append((char *)&local_248);
        }
LAB_001cbae8:
        pbVar20 = pbVar17 + 2;
      }
LAB_001cbc16:
      if (*pbVar20 != 0) {
        pbVar17 = pbVar17 + 1;
      }
    }
    else {
      if (bVar21 != 0x7d) goto LAB_001cb871;
      if (local_268 == iStack_260._M_current) goto LAB_001cbfb5;
      tVar1 = iStack_260._M_current[-1].domain;
      uVar15 = iStack_260._M_current[-1].loc;
      iStack_260._M_current = iStack_260._M_current + -1;
      std::__cxx11::string::append((char *)&local_248,(ulong)pbVar20);
      std::__cxx11::string::substr((ulong)&local_2c0,(ulong)&local_248);
      local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
      local_298._M_string_length = 0;
      local_298.field_2._M_local_buf[0] = '\0';
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
      local_210._M_string_length = 0;
      local_210.field_2._M_local_buf[0] = '\0';
      if (tVar1 == NORMAL) {
        if (((filename == (char *)0x0) ||
            (local_2c0._M_string_length !=
             ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool)
             ::lineVar_abi_cxx11_._M_string_length)) ||
           ((local_2c0._M_string_length != 0 &&
            (iVar6 = bcmp(local_2c0._M_dataplus._M_p,
                          ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool)
                          ::lineVar_abi_cxx11_._M_dataplus._M_p,local_2c0._M_string_length),
            iVar6 != 0)))) {
          psVar8 = GetDef(local_278,&local_2c0);
          if (psVar8 != (string *)0x0) {
            __s._M_p = (pointer)(psVar8->_M_dataplus)._M_p;
            goto LAB_001cb9bb;
          }
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::ostream::_M_insert<long>((long)local_1a8);
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::operator=((string *)&local_298,(string *)&local_1e8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
            operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
        }
LAB_001cbcee:
        if (local_278->SuppressSideEffects == false) {
          MaybeWarnUninitialized(local_278,&local_2c0,filename);
        }
      }
      else {
        if (tVar1 == ENVIRONMENT) {
          bVar5 = cmsys::SystemTools::GetEnv(&local_2c0,&local_210);
          __s._M_p = local_210._M_dataplus._M_p;
          if (bVar5) goto LAB_001cb9bb;
          goto LAB_001cbcee;
        }
        if (tVar1 != CACHE) goto LAB_001cbcee;
        __s._M_p = cmState::GetCacheEntryValue(local_1b0,&local_2c0);
LAB_001cb9bb:
        sVar3 = local_298._M_string_length;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__s._M_p ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) goto LAB_001cbcee;
        if ((char)local_21c == '\0') {
          strlen(__s._M_p);
          std::__cxx11::string::_M_replace((ulong)&local_298,0,(char *)sVar3,(ulong)__s._M_p);
        }
        else {
          local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
          sVar9 = strlen(__s._M_p);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1e8,__s._M_p,__s._M_p + sVar9);
          cmSystemTools::EscapeQuotes((string *)local_1a8,&local_1e8);
          std::__cxx11::string::operator=((string *)&local_298,(string *)local_1a8);
          if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
            operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
            operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
          }
        }
      }
      std::__cxx11::string::replace
                ((ulong)&local_248,uVar15,(char *)(local_240 - uVar15),
                 (ulong)local_298._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p,
                        CONCAT71(local_210.field_2._M_allocated_capacity._1_7_,
                                 local_210.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,
                        CONCAT71(local_298.field_2._M_allocated_capacity._1_7_,
                                 local_298.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
        operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
      }
      pbVar20 = pbVar17 + 1;
    }
LAB_001cbfb5:
    if ((local_218 & 1) != 0) goto LAB_001cc13e;
    bVar21 = pbVar17[1];
    pbVar17 = pbVar17 + 1;
  } while (bVar21 != 0);
  if (local_268 == iStack_260._M_current) {
    std::__cxx11::string::append((char *)&local_248);
    std::__cxx11::string::_M_assign((string *)local_1c8);
  }
  else {
    std::__cxx11::string::append((char *)local_2a0);
LAB_001cc13e:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Syntax error in cmake code ",0x1b);
    if (filename != (char *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"at\n",3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ",2);
      sVar9 = strlen(filename);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,filename,sVar9);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      poVar12 = std::ostream::_M_insert<long>((long)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"when parsing string\n",0x14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ",2);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,(local_1c8->_M_dataplus)._M_p,
                         local_1c8->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,(local_2a0->_M_dataplus)._M_p,local_2a0->_M_string_length);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)local_2a0,(string *)&local_2c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
      operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    local_26c = FATAL_ERROR;
  }
  if (local_268 != (t_lookup *)0x0) {
    operator_delete(local_268,(long)local_258 - (long)local_268);
  }
  if (local_248 != &local_238) {
    operator_delete(local_248,CONCAT71(uStack_237,local_238) + 1);
  }
  return local_26c;
}

Assistant:

MessageType cmMakefile::ExpandVariablesInStringNew(
  std::string& errorstr, std::string& source, bool escapeQuotes,
  bool noEscapes, bool atOnly, const char* filename, long line,
  bool replaceAt) const
{
  // This method replaces ${VAR} and @VAR@ where VAR is looked up
  // with GetDefinition(), if not found in the map, nothing is expanded.
  // It also supports the $ENV{VAR} syntax where VAR is looked up in
  // the current environment variables.

  const char* in = source.c_str();
  const char* last = in;
  std::string result;
  result.reserve(source.size());
  std::vector<t_lookup> openstack;
  bool error = false;
  bool done = false;
  MessageType mtype = MessageType::LOG;

  cmState* state = this->GetCMakeInstance()->GetState();

  static const std::string lineVar = "CMAKE_CURRENT_LIST_LINE";
  do {
    char inc = *in;
    switch (inc) {
      case '}':
        if (!openstack.empty()) {
          t_lookup var = openstack.back();
          openstack.pop_back();
          result.append(last, in - last);
          std::string const& lookup = result.substr(var.loc);
          const char* value = nullptr;
          std::string varresult;
          std::string svalue;
          switch (var.domain) {
            case NORMAL:
              if (filename && lookup == lineVar) {
                std::ostringstream ostr;
                ostr << line;
                varresult = ostr.str();
              } else {
                value = this->GetDefinition(lookup);
              }
              break;
            case ENVIRONMENT:
              if (cmSystemTools::GetEnv(lookup, svalue)) {
                value = svalue.c_str();
              }
              break;
            case CACHE:
              value = state->GetCacheEntryValue(lookup);
              break;
          }
          // Get the string we're meant to append to.
          if (value) {
            if (escapeQuotes) {
              varresult = cmSystemTools::EscapeQuotes(value);
            } else {
              varresult = value;
            }
          } else if (!this->SuppressSideEffects) {
            this->MaybeWarnUninitialized(lookup, filename);
          }
          result.replace(var.loc, result.size() - var.loc, varresult);
          // Start looking from here on out.
          last = in + 1;
        }
        break;
      case '$':
        if (!atOnly) {
          t_lookup lookup;
          const char* next = in + 1;
          const char* start = nullptr;
          char nextc = *next;
          if (nextc == '{') {
            // Looking for a variable.
            start = in + 2;
            lookup.domain = NORMAL;
          } else if (nextc == '<') {
          } else if (!nextc) {
            result.append(last, next - last);
            last = next;
          } else if (cmHasLiteralPrefix(next, "ENV{")) {
            // Looking for an environment variable.
            start = in + 5;
            lookup.domain = ENVIRONMENT;
          } else if (cmHasLiteralPrefix(next, "CACHE{")) {
            // Looking for a cache variable.
            start = in + 7;
            lookup.domain = CACHE;
          } else {
            if (this->cmNamedCurly.find(next)) {
              errorstr = "Syntax $" +
                std::string(next, this->cmNamedCurly.end()) +
                "{} is not supported.  Only ${}, $ENV{}, "
                "and $CACHE{} are allowed.";
              mtype = MessageType::FATAL_ERROR;
              error = true;
            }
          }
          if (start) {
            result.append(last, in - last);
            last = start;
            in = start - 1;
            lookup.loc = result.size();
            openstack.push_back(lookup);
          }
          break;
        }
        CM_FALLTHROUGH;
      case '\\':
        if (!noEscapes) {
          const char* next = in + 1;
          char nextc = *next;
          if (nextc == 't') {
            result.append(last, in - last);
            result.append("\t");
            last = next + 1;
          } else if (nextc == 'n') {
            result.append(last, in - last);
            result.append("\n");
            last = next + 1;
          } else if (nextc == 'r') {
            result.append(last, in - last);
            result.append("\r");
            last = next + 1;
          } else if (nextc == ';' && openstack.empty()) {
            // Handled in ExpandListArgument; pass the backslash literally.
          } else if (isalnum(nextc) || nextc == '\0') {
            errorstr += "Invalid character escape '\\";
            if (nextc) {
              errorstr += nextc;
              errorstr += "'.";
            } else {
              errorstr += "' (at end of input).";
            }
            error = true;
          } else {
            // Take what we've found so far, skipping the escape character.
            result.append(last, in - last);
            // Start tracking from the next character.
            last = in + 1;
          }
          // Skip the next character since it was escaped, but don't read past
          // the end of the string.
          if (*last) {
            ++in;
          }
        }
        break;
      case '\n':
        // Onto the next line.
        ++line;
        break;
      case '\0':
        done = true;
        break;
      case '@':
        if (replaceAt) {
          const char* nextAt = strchr(in + 1, '@');
          if (nextAt && nextAt != in + 1 &&
              nextAt ==
                in + 1 +
                  strspn(in + 1,
                         "ABCDEFGHIJKLMNOPQRSTUVWXYZ"
                         "abcdefghijklmnopqrstuvwxyz"
                         "0123456789/_.+-")) {
            std::string variable(in + 1, nextAt - in - 1);

            std::string varresult;
            if (filename && variable == lineVar) {
              varresult = std::to_string(line);
            } else {
              const std::string* def = this->GetDef(variable);
              if (def) {
                varresult = *def;
              } else if (!this->SuppressSideEffects) {
                this->MaybeWarnUninitialized(variable, filename);
              }
            }

            if (escapeQuotes) {
              varresult = cmSystemTools::EscapeQuotes(varresult);
            }
            // Skip over the variable.
            result.append(last, in - last);
            result.append(varresult);
            in = nextAt;
            last = in + 1;
            break;
          }
        }
      // Failed to find a valid @ expansion; treat it as literal.
      /* FALLTHROUGH */
      default: {
        if (!openstack.empty() &&
            !(isalnum(inc) || inc == '_' || inc == '/' || inc == '.' ||
              inc == '+' || inc == '-')) {
          errorstr += "Invalid character (\'";
          errorstr += inc;
          result.append(last, in - last);
          errorstr += "\') in a variable name: "
                      "'" +
            result.substr(openstack.back().loc) + "'";
          mtype = MessageType::FATAL_ERROR;
          error = true;
        }
        break;
      }
    }
    // Look at the next character.
  } while (!error && !done && *++in);

  // Check for open variable references yet.
  if (!error && !openstack.empty()) {
    // There's an open variable reference waiting.  Policy CMP0010 flags
    // whether this is an error or not.  The new parser now enforces
    // CMP0010 as well.
    errorstr += "There is an unterminated variable reference.";
    error = true;
  }

  if (error) {
    std::ostringstream emsg;
    emsg << "Syntax error in cmake code ";
    if (filename) {
      // This filename and line number may be more specific than the
      // command context because one command invocation can have
      // arguments on multiple lines.
      emsg << "at\n"
           << "  " << filename << ":" << line << "\n";
    }
    emsg << "when parsing string\n"
         << "  " << source << "\n";
    emsg << errorstr;
    mtype = MessageType::FATAL_ERROR;
    errorstr = emsg.str();
  } else {
    // Append the rest of the unchanged part of the string.
    result.append(last);

    source = result;
  }

  return mtype;
}